

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_muls16_mipsel(void *d,void *a,uint64_t b,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    *(short *)((long)d + uVar2) = *(short *)((long)a + uVar2) * (short)b;
    uVar2 = uVar2 + 2;
  } while (uVar2 < uVar1 + 8);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_muls16_mipsel_cold_1();
  return;
}

Assistant:

void HELPER(gvec_muls16)(void *d, void *a, uint64_t b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint16_t)) {
        *(uint16_t *)((char *)d + i) = *(uint16_t *)((char *)a + i) * (uint16_t)b;
    }
    clear_high(d, oprsz, desc);
}